

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O2

void __thiscall CGameClient::OnRender(CGameClient *this)

{
  int i;
  long lVar1;
  
  UpdatePositions(this);
  StartRendering(this);
  for (lVar1 = 0; lVar1 < (this->m_All).m_Num; lVar1 = lVar1 + 1) {
    (*(this->m_All).m_paComponents[lVar1]->_vptr_CComponent[8])();
  }
  (*(this->m_pInput->super_IInterface)._vptr_IInterface[3])();
  CLineInput::RenderCandidates();
  return;
}

Assistant:

void CGameClient::OnRender()
{
	// update the local character and spectate position
	UpdatePositions();

	StartRendering();

	// render all systems
	for(int i = 0; i < m_All.m_Num; i++)
		m_All.m_paComponents[i]->OnRender();

	// clear all events/input for this frame
	Input()->Clear();

	CLineInput::RenderCandidates();
}